

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginDataSegment
          (BinaryReaderInterp *this,Index index,Index memory_index,uint8_t flags)

{
  SegmentMode index_00;
  bool bVar1;
  undefined1 local_d0 [8];
  DataDesc desc;
  Var local_78;
  Enum local_2c;
  SegmentMode local_28;
  uint8_t local_21;
  SegmentMode mode;
  Index IStack_1c;
  uint8_t flags_local;
  Index memory_index_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_21 = flags;
  mode = memory_index;
  IStack_1c = index;
  _memory_index_local = this;
  local_28 = ToSegmentMode(flags);
  index_00 = mode;
  Location::Location((Location *)((long)&desc.offset.field_1 + 8));
  Var::Var(&local_78,index_00,(Location *)((long)&desc.offset.field_1 + 8));
  local_2c = (Enum)SharedValidator::OnDataSegment
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_78,
                              local_28);
  bVar1 = Failed((Result)local_2c);
  Var::~Var(&local_78);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    DataDesc::DataDesc((DataDesc *)local_d0);
    desc.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = local_28;
    desc.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = mode;
    std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::push_back
              (&this->module_->datas,(value_type *)local_d0);
    (this->init_expr_).kind = None;
    Result::Result((Result *)((long)&this_local + 4),Ok);
    DataDesc::~DataDesc((DataDesc *)local_d0);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginDataSegment(Index index,
                                            Index memory_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnDataSegment(loc, Var(memory_index), mode));

  DataDesc desc;
  desc.mode = mode;
  desc.memory_index = memory_index;
  module_.datas.push_back(desc);
  init_expr_.kind = InitExprKind::None;
  return Result::Ok;
}